

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O2

void __thiscall
Resorting::MortonCode64::MortonCode64(MortonCode64 *this,int32_t x,int32_t y,int32_t z)

{
  uint __line;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  char *__assertion;
  
  if (x + 0x100000U < 0x200000) {
    if (y + 0x100000U < 0x200000) {
      if (z + 0x100000U < 0x200000) {
        uVar1 = SplitBy3Bits21(x & 0xfffffU | (uint)x >> 0xb & 0x100000);
        uVar2 = SplitBy3Bits21(y & 0xfffffU | (uint)y >> 0xb & 0x100000);
        uVar3 = SplitBy3Bits21(z & 0xfffffU | (uint)z >> 0xb & 0x100000);
        this->data = (uVar3 << 2 | uVar2 * 2 | uVar1) ^ 0x7000000000000000;
        return;
      }
      __assertion = "-(1 << 20) <= z && z < (1 << 20)";
      __line = 0x35;
    }
    else {
      __assertion = "-(1 << 20) <= y && y < (1 << 20)";
      __line = 0x34;
    }
  }
  else {
    __assertion = "-(1 << 20) <= x && x < (1 << 20)";
    __line = 0x33;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/Morton.cpp"
                ,__line,"Resorting::MortonCode64::MortonCode64(int32_t, int32_t, int32_t)");
}

Assistant:

MortonCode64::MortonCode64(int32_t x, int32_t y, int32_t z)
{
    assert(-(1 << 20) <= x && x < (1 << 20));
    assert(-(1 << 20) <= y && y < (1 << 20));
    assert(-(1 << 20) <= z && z < (1 << 20));
    // move sign bit to bit 20
    x = (x & 0x80000000) >> 11 | (x & 0x0fffff);
    y = (y & 0x80000000) >> 11 | (y & 0x0fffff);
    z = (z & 0x80000000) >> 11 | (z & 0x0fffff);

    data = SplitBy3Bits21(x) | SplitBy3Bits21(y) << 1 | SplitBy3Bits21(z) << 2;
    // invert sign bits
    data = data ^ 0x7000000000000000;

    /*int32_t dx, dy, dz;
    decode(dx, dy, dz);
    assert(x == dx);
    assert(y == dy);
    assert(z == dz);*/
}